

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

SplitTuplePromise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> * __thiscall
kj::_::ForkHub<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>>::splitImpl<0ul,1ul>
          (ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Promise<void>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
           *__return_storage_ptr__,
          ForkHub<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>> *this,
          undefined8 param_3,Promise<kj::Own<capnp::PipelineHook>_> *param_4)

{
  Promise<void> local_40;
  Promise<void> local_30;
  ForkHub<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>> *local_20;
  ForkHub<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> *this_local;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Promise<void>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
  *local_10;
  
  local_20 = this;
  local_10 = __return_storage_ptr__;
  addSplit<0ul>((ForkHub<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>> *)&local_30);
  addSplit<1ul>((ForkHub<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>> *)&local_40);
  tuple<kj::Promise<void>,kj::Promise<kj::Own<capnp::PipelineHook>>>
            (__return_storage_ptr__,(kj *)&local_30,&local_40,param_4);
  Promise<kj::Own<capnp::PipelineHook>_>::~Promise
            ((Promise<kj::Own<capnp::PipelineHook>_> *)&local_40);
  Promise<void>::~Promise(&local_30);
  return __return_storage_ptr__;
}

Assistant:

_::SplitTuplePromise<T> splitImpl(Indexes<indexes...>) {
    return kj::tuple(addSplit<indexes>()...);
  }